

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Roller.cxx
# Opt level: O0

void __thiscall Fl_Roller::draw(Fl_Roller *this)

{
  byte bVar1;
  int iVar2;
  Fl_Boxtype FVar3;
  int iVar4;
  Fl_Color FVar5;
  int W_00;
  int H_00;
  Fl_Widget *pFVar6;
  double dVar7;
  double dVar8;
  int local_c4;
  int local_ac;
  int local_9c;
  int local_7c;
  double dStack_78;
  int yy1_1;
  double yy_1;
  double junk_1;
  int h2_1;
  int i_1;
  int h1_1;
  int yy1;
  double yy;
  double junk;
  int local_40;
  int h2;
  int i;
  int h1;
  double delta;
  double ARC;
  int local_20;
  int offset;
  int H;
  int W;
  int Y;
  int X;
  Fl_Roller *this_local;
  
  _Y = this;
  bVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar1 & 0x80) != 0) {
    Fl_Widget::draw_box((Fl_Widget *)this);
  }
  iVar2 = Fl_Widget::x((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dx(FVar3);
  W = iVar2 + iVar4;
  iVar2 = Fl_Widget::y((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dy(FVar3);
  H = iVar2 + iVar4;
  iVar2 = Fl_Widget::w((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dw(FVar3);
  offset = (iVar2 - iVar4) + -1;
  iVar2 = Fl_Widget::h((Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  iVar4 = Fl::box_dh(FVar3);
  local_20 = (iVar2 - iVar4) + -1;
  if (offset < 1) {
    return;
  }
  if (local_20 < 1) {
    return;
  }
  dVar7 = Fl_Valuator::step(&this->super_Fl_Valuator);
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    dVar7 = Fl_Valuator::value(&this->super_Fl_Valuator);
    dVar8 = Fl_Valuator::step(&this->super_Fl_Valuator);
    local_9c = (int)(dVar7 / dVar8);
  }
  else {
    local_9c = 0;
  }
  ARC._4_4_ = local_9c;
  delta = 1.5;
  _i = 0x3fc999999999999a;
  iVar2 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
  if (iVar2 == 0) {
    h2_1 = local_20 / 4 + 1;
    FVar5 = Fl_Widget::color((Fl_Widget *)this);
    fl_color(FVar5);
    fl_rectf(W,H + h2_1,offset,local_20 + h2_1 * -2);
    junk_1._4_4_ = 0;
    while (h2_1 != 0) {
      fl_color(0x30 - junk_1._4_4_);
      if (0x30U - junk_1._4_4_ < 0x28) {
        local_c4 = 0;
      }
      else {
        local_c4 = (h2_1 << 1) / 3 + 1;
      }
      junk_1._0_4_ = local_c4;
      fl_rectf(W,H + local_c4,offset,h2_1 - local_c4);
      fl_rectf(W,(H + local_20) - h2_1,offset,h2_1 - junk_1._0_4_);
      junk_1._4_4_ = junk_1._4_4_ + 1;
      h2_1 = junk_1._0_4_;
    }
    iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar2 != 0) {
      dVar7 = (double)ARC._4_4_;
      dVar8 = sin(1.5);
      dVar7 = modf(((dVar7 * dVar8) / (double)(local_20 / 2)) / 0.2,&yy_1);
      dStack_78 = dVar7 * 0.2 + -1.5;
      do {
        dVar7 = sin(dStack_78);
        dVar8 = sin(1.5);
        local_7c = (int)(((dVar7 / dVar8 + 1.0) * (double)local_20) / 2.0);
        if (0 < local_7c) {
          if (local_20 + -1 <= local_7c) goto LAB_0020e40f;
          fl_color(0x27);
          fl_xyline(W + 1,H + local_7c,W + offset + -1);
          if (0.0 <= dStack_78) {
            local_7c = local_7c + 1;
          }
          else {
            local_7c = local_7c + -1;
          }
          fl_color(0x32);
          fl_xyline(W + 1,H + local_7c,W + offset + -1);
        }
        dStack_78 = dStack_78 + 0.2;
      } while( true );
    }
  }
  else {
    h2 = offset / 4 + 1;
    FVar5 = Fl_Widget::color((Fl_Widget *)this);
    fl_color(FVar5);
    fl_rectf(W + h2,H,offset + h2 * -2,local_20);
    local_40 = 0;
    while (h2 != 0) {
      fl_color(0x30 - local_40);
      if (0x30U - local_40 < 0x28) {
        local_ac = 0;
      }
      else {
        local_ac = (h2 << 1) / 3 + 1;
      }
      junk._4_4_ = local_ac;
      fl_rectf(W + local_ac,H,h2 - local_ac,local_20);
      fl_rectf((W + offset) - h2,H,h2 - junk._4_4_,local_20);
      local_40 = local_40 + 1;
      h2 = junk._4_4_;
    }
    iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar2 != 0) {
      dVar7 = (double)ARC._4_4_;
      dVar8 = sin(1.5);
      dVar7 = modf(((dVar7 * dVar8) / (double)(offset / 2)) / 0.2,&yy);
      _h1_1 = dVar7 * 0.2 + -1.5;
      do {
        dVar7 = sin(_h1_1);
        dVar8 = sin(1.5);
        i_1 = (int)(((dVar7 / dVar8 + 1.0) * (double)offset) / 2.0);
        if (0 < i_1) {
          if (offset + -1 <= i_1) goto LAB_0020e0fc;
          fl_color(0x27);
          fl_yxline(W + i_1,H + 1,H + local_20 + -1);
          if (0.0 <= _h1_1) {
            i_1 = i_1 + 1;
          }
          else {
            i_1 = i_1 + -1;
          }
          fl_color(0x32);
          fl_yxline(W + i_1,H + 1,H + local_20 + -1);
        }
        _h1_1 = _h1_1 + 0.2;
      } while( true );
    }
  }
LAB_0020e4d3:
  pFVar6 = Fl::focus();
  if (pFVar6 == (Fl_Widget *)this) {
    iVar2 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    W_00 = Fl_Widget::w((Fl_Widget *)this);
    H_00 = Fl_Widget::h((Fl_Widget *)this);
    Fl_Widget::draw_focus((Fl_Widget *)this,FL_THIN_UP_FRAME,iVar2,iVar4,W_00,H_00);
  }
  return;
LAB_0020e40f:
  h2_1 = local_20 / 8 + 1;
  fl_color(0x2d);
  fl_yxline(W + offset + -1,H + h2_1,(H + local_20) - h2_1);
  fl_color(0x27);
  fl_xyline(W + offset,H,W,H + h2_1);
  fl_yxline(W,(H + local_20) - h2_1,H + local_20);
  fl_color(0x34);
  fl_yxline(W,H + h2_1,(H + local_20) - h2_1);
  fl_xyline(W,H + local_20,W + offset,(H + local_20) - h2_1);
  fl_yxline(W + offset,H + h2_1,H);
  goto LAB_0020e4d3;
LAB_0020e0fc:
  h2 = offset / 8 + 1;
  fl_color(0x2d);
  fl_xyline(W + h2,H + local_20 + -1,(W + offset) - h2);
  fl_color(0x27);
  fl_yxline(W,H + local_20,H,W + h2);
  fl_xyline((W + offset) - h2,H,W + offset);
  fl_color(0x34);
  fl_xyline(W + h2,H + -1,(W + offset) - h2);
  fl_yxline(W + offset,H,H + local_20,(W + offset) - h2);
  fl_xyline(W + h2,H + local_20,W);
  goto LAB_0020e4d3;
}

Assistant:

void Fl_Roller::draw() {
  if (damage()&FL_DAMAGE_ALL) draw_box();
  int X = x()+Fl::box_dx(box());
  int Y = y()+Fl::box_dy(box());
  int W = w()-Fl::box_dw(box())-1;
  int H = h()-Fl::box_dh(box())-1;
  if (W<=0 || H <=0) return;
  int offset = step() ? int(value()/step()) : 0;
  const double ARC = 1.5; // 1/2 the number of radians visible
  const double delta = .2; // radians per knurl
  if (horizontal()) { // horizontal one
    // draw shaded ends of wheel:
    int h1 = W/4+1; // distance from end that shading starts
    fl_color(color()); fl_rectf(X+h1,Y,W-2*h1,H);
    for (int i=0; h1; i++) {
      fl_color((Fl_Color)(FL_GRAY-i-1));
      int h2 = FL_GRAY-i-1 > FL_DARK3 ? 2*h1/3+1 : 0;
      fl_rectf(X+h2,Y,h1-h2,H);
      fl_rectf(X+W-h1,Y,h1-h2,H);
      h1 = h2;
    }
    if (active_r()) {
      // draw ridges:
      double junk;
      for (double yy = -ARC+modf(offset*sin(ARC)/(W/2)/delta,&junk)*delta;;
	   yy += delta) {
	int yy1 = int((sin(yy)/sin(ARC)+1)*W/2);
	if (yy1 <= 0) continue; else if (yy1 >= W-1) break;
	fl_color(FL_DARK3); fl_yxline(X+yy1,Y+1,Y+H-1);
	if (yy < 0) yy1--; else yy1++;
	fl_color(FL_LIGHT1);fl_yxline(X+yy1,Y+1,Y+H-1);
      }
      // draw edges:
      h1 = W/8+1; // distance from end the color inverts
      fl_color(FL_DARK2);
      fl_xyline(X+h1,Y+H-1,X+W-h1);
      fl_color(FL_DARK3);
      fl_yxline(X,Y+H,Y,X+h1);
      fl_xyline(X+W-h1,Y,X+W);
      fl_color(FL_LIGHT2);
      fl_xyline(X+h1,Y-1,X+W-h1);
      fl_yxline(X+W,Y,Y+H,X+W-h1);
      fl_xyline(X+h1,Y+H,X);
    }
  } else { // vertical one
    // draw shaded ends of wheel:
    int h1 = H/4+1; // distance from end that shading starts
    fl_color(color()); fl_rectf(X,Y+h1,W,H-2*h1);
    for (int i=0; h1; i++) {
      fl_color((Fl_Color)(FL_GRAY-i-1));
      int h2 = FL_GRAY-i-1 > FL_DARK3 ? 2*h1/3+1 : 0;
      fl_rectf(X,Y+h2,W,h1-h2);
      fl_rectf(X,Y+H-h1,W,h1-h2);
      h1 = h2;
    }
    if (active_r()) {
      // draw ridges:
      double junk;
      for (double yy = -ARC+modf(offset*sin(ARC)/(H/2)/delta,&junk)*delta;
	   ; yy += delta) {
	int yy1 = int((sin(yy)/sin(ARC)+1)*H/2);
	if (yy1 <= 0) continue; else if (yy1 >= H-1) break;
	fl_color(FL_DARK3); fl_xyline(X+1,Y+yy1,X+W-1);
	if (yy < 0) yy1--; else yy1++;
	fl_color(FL_LIGHT1);fl_xyline(X+1,Y+yy1,X+W-1);
      }
      // draw edges:
      h1 = H/8+1; // distance from end the color inverts
      fl_color(FL_DARK2);
      fl_yxline(X+W-1,Y+h1,Y+H-h1);
      fl_color(FL_DARK3);
      fl_xyline(X+W,Y,X,Y+h1);
      fl_yxline(X,Y+H-h1,Y+H);
      fl_color(FL_LIGHT2);
      fl_yxline(X,Y+h1,Y+H-h1);
      fl_xyline(X,Y+H,X+W,Y+H-h1);
      fl_yxline(X+W,Y+h1,Y);
    }
  }

  if (Fl::focus() == this) draw_focus(FL_THIN_UP_FRAME, x(), y(), w(), h());
}